

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_thread.h
# Opt level: O2

__pid_t __thiscall MppThread::wait(MppThread *this,void *__stat_loc)

{
  MppThreadStatus MVar1;
  __pid_t _Var2;
  char *__stat_loc_00;
  ulong uVar3;
  
  __stat_loc_00 = (char *)__stat_loc;
  if (3 < (int)__stat_loc) {
    __stat_loc_00 = "mpp_enc";
    _mpp_log_l(2,"mpp_enc","Assertion %s failed at %s:%d\n",(char *)0x0,"id < THREAD_SIGNAL_BUTT",
               "wait",0x105);
    if ((mpp_debug._3_1_ & 0x10) != 0) {
      abort();
    }
  }
  uVar3 = (ulong)__stat_loc & 0xffffffff;
  MVar1 = this->mStatus[uVar3];
  this->mStatus[uVar3] = MPP_THREAD_WAITING;
  _Var2 = MppMutexCond::wait(this->mMutexCond + uVar3,__stat_loc_00);
  if (this->mStatus[uVar3] == MPP_THREAD_WAITING) {
    this->mStatus[uVar3] = MVar1;
  }
  return _Var2;
}

Assistant:

void wait(MppThreadSignal id = THREAD_WORK) {
        mpp_assert(id < THREAD_SIGNAL_BUTT);
        MppThreadStatus status = mStatus[id];

        mStatus[id] = MPP_THREAD_WAITING;
        mMutexCond[id].wait();

        // check the status is not changed then restore status
        if (mStatus[id] == MPP_THREAD_WAITING)
            mStatus[id] = status;
    }